

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::
InternalSwap(RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode> *this,
            RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode> *other)

{
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode> *other_local;
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode> *this_local;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }